

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoop::~EventLoop(EventLoop *this)

{
  bool bVar1;
  LogLevel LVar2;
  sz_pid_t v;
  LogStream *pLVar3;
  self *psVar4;
  reference this_00;
  pointer pCVar5;
  __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *__rhs;
  long *in_FS_OFFSET;
  SourceFile file;
  Functor *functor;
  iterator __end2;
  iterator __begin2;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range2;
  undefined4 local_fe8;
  Logger local_fe0;
  EventLoop *local_10;
  EventLoop *this_local;
  
  this->_vptr_EventLoop = (_func_int **)&PTR__EventLoop_00144b98;
  local_10 = this;
  LVar2 = Logger::logLevel();
  if ((int)LVar2 < 2) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)&__range2,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)__range2;
    file.m_size = local_fe8;
    Logger::Logger(&local_fe0,file,0x48,DEBUG,"~EventLoop");
    pLVar3 = Logger::stream(&local_fe0);
    psVar4 = LogStream::operator<<(pLVar3,"EventLoop ");
    pLVar3 = LogStream::operator<<(psVar4,this);
    psVar4 = LogStream::operator<<(pLVar3," of thread ");
    pLVar3 = LogStream::operator<<(psVar4,this->m_threadId);
    psVar4 = LogStream::operator<<(pLVar3," destructs in thread ");
    v = CurrentThread::tid();
    LogStream::operator<<(psVar4,v);
    Logger::~Logger(&local_fe0);
  }
  assertInLoopThread(this);
  __end2 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::begin
                     (&this->m_pendingFunctors);
  functor = (Functor *)
            std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::end
                      (&this->m_pendingFunctors);
  while( true ) {
    __rhs = (__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
             *)&functor;
    bVar1 = __gnu_cxx::operator!=(&__end2,__rhs);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
              ::operator*(&__end2);
    std::function<void_()>::operator()(this_00);
    __gnu_cxx::
    __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::operator++(&__end2);
  }
  pCVar5 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_wakeupChannel);
  Channel::disableAll(pCVar5);
  pCVar5 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_wakeupChannel);
  Channel::remove(pCVar5,(char *)__rhs);
  sockets::sz_close_eventfd(&this->m_wakeupFd);
  *(undefined8 *)(*in_FS_OFFSET + -0x238) = 0;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->m_pendingFunctors);
  MutexLock::~MutexLock(&this->m_mutex);
  std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::~vector
            (&this->m_activeChannels);
  std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::~unique_ptr
            (&this->m_wakeupChannel);
  std::unique_ptr<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>::~unique_ptr
            (&this->m_timerQueue);
  std::unique_ptr<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>::~unique_ptr
            (&this->m_poller);
  return;
}

Assistant:

EventLoop::~EventLoop()
{
	LOG_DEBUG << "EventLoop " << this << " of thread " << m_threadId
		<< " destructs in thread " << CurrentThread::tid();
	assertInLoopThread();
	for (const Functor& functor : m_pendingFunctors)
	{
		functor();
	}
	// 停止fd所有事件
	m_wakeupChannel->disableAll();
	// poll中也移除
	m_wakeupChannel->remove();
	sockets::sz_close_eventfd(m_wakeupFd);
	t_loopInThisThread = nullptr;
}